

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conjunction_filter.cpp
# Opt level: O1

string * __thiscall
duckdb::ConjunctionAndFilter::ToString
          (string *__return_storage_ptr__,ConjunctionAndFilter *this,string *column_name)

{
  const_reference this_00;
  pointer pTVar1;
  size_type __n;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((this->super_ConjunctionFilter).child_filters.
      super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->super_ConjunctionFilter).child_filters.
      super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      if (__n != 0) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      this_00 = vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_true>
                ::operator[](&(this->super_ConjunctionFilter).child_filters,__n);
      pTVar1 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
               operator->(this_00);
      (*pTVar1->_vptr_TableFilter[3])(local_50,pTVar1,column_name);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)(this->super_ConjunctionFilter).child_filters.
                                 super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->super_ConjunctionFilter).child_filters.
                                 super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return __return_storage_ptr__;
}

Assistant:

string ConjunctionAndFilter::ToString(const string &column_name) const {
	string result;
	for (idx_t i = 0; i < child_filters.size(); i++) {
		if (i > 0) {
			result += " AND ";
		}
		result += child_filters[i]->ToString(column_name);
	}
	return result;
}